

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall FailableMemoryAllocator::clearFailedAllocs(FailableMemoryAllocator *this)

{
  long *in_RDI;
  LocationToFailAllocNode *current;
  long local_10;
  
  local_10 = in_RDI[5];
  while (local_10 != 0) {
    in_RDI[5] = *(long *)(local_10 + 0x18);
    (**(code **)(*in_RDI + 0x18))
              (in_RDI,local_10,0,
               "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O0/_deps/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x187);
    local_10 = in_RDI[5];
  }
  *(undefined4 *)(in_RDI + 6) = 0;
  return;
}

Assistant:

void FailableMemoryAllocator::clearFailedAllocs()
{
  LocationToFailAllocNode* current = head_;
  while (current) {
    head_ = current->next_;
    free_memory((char*) current, 0, __FILE__, __LINE__);
    current = head_;
  }
  currentAllocNumber_ = 0;
}